

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ulong __thiscall nuraft::inmem_log_store::term_at(inmem_log_store *this,ulong index)

{
  _Base_ptr p_Var1;
  ulong uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar3 == 0) {
    p_Var6 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = p_Var1;
    p_Var4 = &p_Var6->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < index]) {
      if (*(ulong *)(p_Var5 + 1) >= index) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var6->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var6) && (p_Var5 = p_Var4, index < *(ulong *)(p_Var4 + 1)))
    {
      p_Var5 = &p_Var6->_M_header;
    }
    p_Var4 = &p_Var6->_M_header;
    if ((_Rb_tree_header *)p_Var5 == p_Var6) {
      while (p_Var5 = p_Var1, p_Var5 != (_Base_ptr)0x0) {
        p_Var4 = p_Var5;
        p_Var1 = p_Var5->_M_left;
      }
      p_Var5 = &p_Var6->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var6) && (*(long *)(p_Var4 + 1) == 0)) {
        p_Var5 = p_Var4;
      }
    }
    uVar2 = *(ulong *)p_Var5[1]._M_parent;
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    return uVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

ulong inmem_log_store::term_at(ulong index) {
    ulong term = 0;
    {   std::lock_guard<std::mutex> l(logs_lock_);
        auto entry = logs_.find(index);
        if (entry == logs_.end()) {
            entry = logs_.find(0);
        }
        term = entry->second->get_term();
    }
    return term;
}